

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.c
# Opt level: O3

int annotation_final_check(lys_ext_instance *ext)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  lys_ext *plVar5;
  lys_ext_instance *plVar6;
  undefined8 *puVar7;
  long lVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  puVar7 = (undefined8 *)lys_ext_complex_get_substmt(0x30,ext,0);
  if (*(int *)*puVar7 == 9) {
    lyext_log(ext->module->ctx,0,"Annotations","annotation_final_check",
              "The leafref type is not supported for annotations (annotation %s).",ext->arg_value);
  }
  else {
    uVar3._0_2_ = ext->flags;
    uVar3._2_1_ = ext->ext_size;
    uVar3._3_1_ = ext->insubstmt_index;
    if ((uVar3 >> 8 & 1) != 0) {
      ext->flags = (undefined2)uVar3 & 0xfeff;
      return 0;
    }
    lVar8 = lys_main_module(ext->parent);
    bVar2 = *(byte *)(lVar8 + 0x50);
    if ((ulong)bVar2 == 0) {
      bVar9 = 0;
    }
    else {
      lVar4 = *(long *)(lVar8 + 0xa0);
      plVar5 = ext->def;
      uVar11 = 0;
      bVar9 = 0;
      do {
        plVar6 = *(lys_ext_instance **)(lVar4 + uVar11 * 8);
        if ((plVar6->def == plVar5) && (plVar6->arg_value == ext->arg_value)) {
          if (plVar6 != ext) {
            pbVar1 = (byte *)((long)&plVar6->flags + 1);
            *pbVar1 = *pbVar1 | 1;
          }
          bVar9 = bVar9 + 1;
        }
        uVar11 = uVar11 + 1;
      } while (bVar2 != uVar11);
    }
    bVar2 = *(byte *)(lVar8 + 0x46);
    if ((ulong)bVar2 != 0) {
      lVar8 = *(long *)(lVar8 + 0x68);
      uVar11 = 0;
      do {
        lVar4 = *(long *)(lVar8 + uVar11 * 0x30);
        uVar10 = (ulong)*(byte *)(lVar4 + 0x50);
        if (uVar10 != 0) {
          lVar4 = *(long *)(lVar4 + 0xa0);
          plVar5 = ext->def;
          uVar12 = 0;
          do {
            plVar6 = *(lys_ext_instance **)(lVar4 + uVar12 * 8);
            if ((plVar6->def == plVar5) && (plVar6->arg_value == ext->arg_value)) {
              if (plVar6 != ext) {
                pbVar1 = (byte *)((long)&plVar6->flags + 1);
                *pbVar1 = *pbVar1 | 1;
              }
              bVar9 = bVar9 + 1;
            }
            uVar12 = uVar12 + 1;
          } while (uVar10 != uVar12);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != bVar2);
    }
    if (bVar9 < 2) {
      return 0;
    }
    lyext_log(ext->module->ctx,0,"Annotations","annotation_final_check",
              "Annotation instance %s is not unique, there are %d instances with the same name in module %s."
              ,ext->arg_value,bVar9,*(undefined8 *)((long)ext->parent + 8));
  }
  return 1;
}

Assistant:

int
annotation_final_check(struct lys_ext_instance *ext)
{
    uint8_t  i, j, c;
    struct lys_module *mod;
    struct lys_submodule *submod;
    struct lys_type *type;

    /*
     * check type - leafref is not allowed
     */
    type = *(struct lys_type**)lys_ext_complex_get_substmt(LY_STMT_TYPE, (struct lys_ext_instance_complex *)ext, NULL);
    if (type->base == LY_TYPE_LEAFREF) {
        LYEXT_LOG(ext->module->ctx, LY_LLERR, "Annotations", "The leafref type is not supported for annotations (annotation %s).",
                  ext->arg_value);
        return 1;
    }

    /*
     * check duplication
     */
    if (ext->flags & LYEXT_OPT_PLUGIN1) {
        /* already checked */
        ext->flags &= ~LYEXT_OPT_PLUGIN1;
        return 0;
    }

    mod = lys_main_module((struct lys_module *)ext->parent);

    for (i = c = 0; i < mod->ext_size; i++) {
        /* note, that it is not necessary to check also ext->insubstmt since
         * annotation_position() ensures that annotation instances are placed only
         * in module or submodule */
        if (mod->ext[i]->def == ext->def && mod->ext[i]->arg_value == ext->arg_value) {
            if (mod->ext[i] != ext) {
                /* do not mark the instance being checked */
                mod->ext[i]->flags |= LYEXT_OPT_PLUGIN1;
            }
            c++;
        }
    }
    /* similarly, go through the all extensions in the main module submodules */
    for (j = 0; j < mod->inc_size; j++) {
        submod = mod->inc[j].submodule; /* shortcut */
        for (i = 0; i < submod->ext_size; i++) {
            if (submod->ext[i]->def == ext->def && submod->ext[i]->arg_value == ext->arg_value) {
                if (submod->ext[i] != ext) {
                    /* do not mark the instance being checked */
                    submod->ext[i]->flags |= LYEXT_OPT_PLUGIN1;
                }
                c++;
            }
        }
    }

    if (c > 1) {
        LYEXT_LOG(ext->module->ctx, LY_LLERR, "Annotations",
                  "Annotation instance %s is not unique, there are %d instances with the same name in module %s.",
                  ext->arg_value, c, ((struct lys_module *)ext->parent)->name);
        return 1;
    } else {
        return 0;
    }
}